

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOUT_madhu.cpp
# Opt level: O2

vector<Track,_std::allocator<Track>_> *
IOU_tracker(vector<Track,_std::allocator<Track>_> *__return_storage_ptr__,float sigma_l,
           float sigma_h,float sigma_iou,int t_min,
           vector<std::vector<Boundingbox,_std::allocator<Boundingbox>_>,_std::allocator<std::vector<Boundingbox,_std::allocator<Boundingbox>_>_>_>
           *detections)

{
  pointer pBVar1;
  Boundingbox BVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  pointer pTVar7;
  int iVar8;
  ulong uVar9;
  pointer pBVar10;
  int i;
  int iVar11;
  pointer pTVar12;
  float fVar13;
  vector<Track,_std::allocator<Track>_> active_tracks;
  vector<Boundingbox,_std::allocator<Boundingbox>_> frame_boxes;
  Track track;
  Boundingbox box;
  vector<Boundingbox,_std::allocator<Boundingbox>_> new_box;
  _Vector_base<Boundingbox,_std::allocator<Boundingbox>_> local_48;
  
  active_tracks.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  active_tracks.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  active_tracks.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Track,_std::allocator<Track>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Track,_std::allocator<Track>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Track,_std::allocator<Track>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Boundingbox,_std::allocator<Boundingbox>_>::vector
            (&frame_boxes,*(vector<Boundingbox,_std::allocator<Boundingbox>_> **)detections);
  iVar11 = 0;
  do {
    pBVar1 = frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar9 = (ulong)iVar11;
    if ((ulong)(((long)active_tracks.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)active_tracks.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x28) <= uVar9) {
      for (pBVar10 = frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pTVar7 = active_tracks.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                   super__Vector_impl_data._M_finish, pBVar10 != pBVar1; pBVar10 = pBVar10 + 1) {
        box.score = pBVar10->score;
        box.x = pBVar10->x;
        box.y = pBVar10->y;
        box.w = pBVar10->w;
        box.h = pBVar10->h;
        new_box.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        new_box.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        new_box.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<Boundingbox,_std::allocator<Boundingbox>_>::push_back
                  ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)
                   &new_box.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>,&box);
        std::vector<Boundingbox,_std::allocator<Boundingbox>_>::vector
                  (&track.boxes,
                   (vector<Boundingbox,_std::allocator<Boundingbox>_> *)
                   &new_box.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>);
        track.max_score = box.score;
        track.start_frame = 0;
        track.track_id = 0;
        std::vector<Track,_std::allocator<Track>_>::push_back(&active_tracks,&track);
        std::_Vector_base<Boundingbox,_std::allocator<Boundingbox>_>::~_Vector_base
                  ((_Vector_base<Boundingbox,_std::allocator<Boundingbox>_> *)&track);
        std::_Vector_base<Boundingbox,_std::allocator<Boundingbox>_>::~_Vector_base
                  (&new_box.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>);
      }
      for (pTVar12 = active_tracks.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                     super__Vector_impl_data._M_start; pTVar12 != pTVar7; pTVar12 = pTVar12 + 1) {
        Track::Track(&track,pTVar12);
        if ((sigma_h <= track.max_score) &&
           ((ulong)(long)t_min <=
            (ulong)(((long)track.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)track.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x14))) {
          std::vector<Track,_std::allocator<Track>_>::push_back(__return_storage_ptr__,&track);
        }
        std::_Vector_base<Boundingbox,_std::allocator<Boundingbox>_>::~_Vector_base
                  ((_Vector_base<Boundingbox,_std::allocator<Boundingbox>_> *)&track);
      }
      std::_Vector_base<Boundingbox,_std::allocator<Boundingbox>_>::~_Vector_base
                (&frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>);
      std::vector<Track,_std::allocator<Track>_>::~vector(&active_tracks);
      return __return_storage_ptr__;
    }
    Track::Track(&track,active_tracks.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar9);
    BVar2 = track.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
    std::vector<Boundingbox,_std::allocator<Boundingbox>_>::vector
              ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)&local_48,&frame_boxes);
    iVar8 = Highest_iou(BVar2,(vector<Boundingbox,_std::allocator<Boundingbox>_> *)&local_48);
    std::_Vector_base<Boundingbox,_std::allocator<Boundingbox>_>::~_Vector_base(&local_48);
    pBVar1 = frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar8 == -1) {
LAB_00106957:
      if ((sigma_h < track.max_score) &&
         ((ulong)(long)t_min <
          (ulong)(((long)track.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)track.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x14))) {
        std::vector<Track,_std::allocator<Track>_>::push_back(__return_storage_ptr__,&track);
      }
      std::vector<Track,_std::allocator<Track>_>::erase
                (&active_tracks,
                 active_tracks.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar9);
      iVar11 = iVar11 + -1;
    }
    else {
      pBVar10 = frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                super__Vector_impl_data._M_start + iVar8;
      uVar3 = pBVar10->x;
      uVar4 = pBVar10->y;
      uVar5 = pBVar10->w;
      uVar6 = pBVar10->h;
      BVar2.h = (float)uVar6;
      BVar2.w = (float)uVar5;
      BVar2.y = (float)uVar4;
      BVar2.x = (float)uVar3;
      BVar2.score = frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar8].score;
      fVar13 = find_IOU(track.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1],BVar2);
      if (fVar13 < sigma_iou) goto LAB_00106957;
      std::vector<Boundingbox,_std::allocator<Boundingbox>_>::push_back(&track.boxes,pBVar1 + iVar8)
      ;
      if (track.max_score <
          frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
          super__Vector_impl_data._M_start[iVar8].score) {
        track.max_score =
             frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
             super__Vector_impl_data._M_start[iVar8].score;
      }
      pBVar1 = frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
               super__Vector_impl_data._M_start + iVar8 + 1;
      if (pBVar1 != frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        memmove(frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                super__Vector_impl_data._M_start + iVar8,pBVar1,
                (long)frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1);
      }
      frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
      super__Vector_impl_data._M_finish =
           frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      Track::operator=(active_tracks.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar9,&track);
    }
    std::_Vector_base<Boundingbox,_std::allocator<Boundingbox>_>::~_Vector_base
              ((_Vector_base<Boundingbox,_std::allocator<Boundingbox>_> *)&track);
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

std::vector< Track > IOU_tracker(float sigma_l, float sigma_h, float sigma_iou, int t_min, std::vector< std::vector<Boundingbox> > detections)
{
	
	int index;
	bool updated;

	// initiate active tracks, finished tracks
	std::vector<Track> active_tracks;
	std::vector<Track> finished_tracks;

	// do for all the frames
	for (int frame_no = 0; frame_no < detections.size(); frame_no++)
	{
		// get detections from the frame
		std::vector<Boundingbox> frame_boxes = detections[frame_no];

		// for each track in active tracks
		for (int i = 0; i < active_tracks.size(); i++)
		{
			Track track = active_tracks[i];
			updated = false;
			// the index of box with highest iou
			index = Highest_iou(track.boxes.back(), frame_boxes);

			// if no box is found or 
			if (index != -1 && find_IOU(track.boxes.back(), frame_boxes[index]) >= sigma_iou)
			{
				track.boxes.push_back(frame_boxes[index]);

				if (track.max_score < frame_boxes[index].score)
				{
					// update the score in tracks
					track.max_score = frame_boxes[index].score;
				}
				frame_boxes.erase(frame_boxes.begin() + index);

				// updating the track
				active_tracks[i] = track;
				updated = true;
			}

			// if not updated, append them into finished tracks
			if (!updated)
			{
				if (track.max_score > sigma_h && track.boxes.size() > t_min)
				{
					finished_tracks.push_back(track);	
				}
				// 
				active_tracks.erase(active_tracks.begin() + i);

				i--;
			}
		}

		// add new tracks in active tracks
		for ( auto box : frame_boxes)
		{
			std::vector<Boundingbox> new_box;

			new_box.push_back(box);

			Track t = {new_box, box.score, frame_no, 0};
			
			active_tracks.push_back(t);
		}

		// creating new tracks
		for (auto track : active_tracks)
		{
			if (track.max_score >= sigma_h && track.boxes.size() >= t_min)
			{
				finished_tracks.push_back(track);
			}
		}

		return finished_tracks;

	}
}